

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.cpp
# Opt level: O0

void __thiscall
pbrt::StatRegisterer::StatRegisterer(StatRegisterer *this,AccumFunc func,PixelAccumFunc pfunc)

{
  value_type *pp_Var1;
  void *pvVar2;
  long in_RDX;
  long in_RSI;
  lock_guard<std::mutex> lock;
  mutex_type *in_stack_ffffffffffffffb8;
  lock_guard<std::mutex> *in_stack_ffffffffffffffc0;
  value_type *in_stack_ffffffffffffffc8;
  vector<void_(*)(const_pbrt::Point2<int>_&,_int,_pbrt::PixelStatsAccumulator_&),_std::allocator<void_(*)(const_pbrt::Point2<int>_&,_int,_pbrt::PixelStatsAccumulator_&)>_>
  *in_stack_ffffffffffffffd0;
  
  std::lock_guard<std::mutex>::lock_guard(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  if (statFuncs == (value_type *)0x0) {
    pp_Var1 = (value_type *)operator_new(0x18);
    std::
    vector<void_(*)(pbrt::StatsAccumulator_&),_std::allocator<void_(*)(pbrt::StatsAccumulator_&)>_>
    ::vector((vector<void_(*)(pbrt::StatsAccumulator_&),_std::allocator<void_(*)(pbrt::StatsAccumulator_&)>_>
              *)0x54fc19);
    statFuncs = pp_Var1;
    in_stack_ffffffffffffffc8 = statFuncs;
  }
  if (in_RSI != 0) {
    std::
    vector<void_(*)(pbrt::StatsAccumulator_&),_std::allocator<void_(*)(pbrt::StatsAccumulator_&)>_>
    ::push_back((vector<void_(*)(pbrt::StatsAccumulator_&),_std::allocator<void_(*)(pbrt::StatsAccumulator_&)>_>
                 *)in_stack_ffffffffffffffd0,(value_type *)in_stack_ffffffffffffffc8);
  }
  if (pixelStatFuncs == (void *)0x0) {
    pvVar2 = operator_new(0x18);
    std::
    vector<void_(*)(const_pbrt::Point2<int>_&,_int,_pbrt::PixelStatsAccumulator_&),_std::allocator<void_(*)(const_pbrt::Point2<int>_&,_int,_pbrt::PixelStatsAccumulator_&)>_>
    ::vector((vector<void_(*)(const_pbrt::Point2<int>_&,_int,_pbrt::PixelStatsAccumulator_&),_std::allocator<void_(*)(const_pbrt::Point2<int>_&,_int,_pbrt::PixelStatsAccumulator_&)>_>
              *)0x54fc83);
    pixelStatFuncs = pvVar2;
  }
  if (in_RDX != 0) {
    std::
    vector<void_(*)(const_pbrt::Point2<int>_&,_int,_pbrt::PixelStatsAccumulator_&),_std::allocator<void_(*)(const_pbrt::Point2<int>_&,_int,_pbrt::PixelStatsAccumulator_&)>_>
    ::push_back(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  }
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x54fcb6);
  return;
}

Assistant:

StatRegisterer::StatRegisterer(AccumFunc func, PixelAccumFunc pfunc) {
    static std::mutex mutex;
    std::lock_guard<std::mutex> lock(mutex);

    if (statFuncs == nullptr)
        statFuncs = new std::vector<AccumFunc>;
    if (func)
        statFuncs->push_back(func);

    if (pixelStatFuncs == nullptr)
        pixelStatFuncs = new std::vector<PixelAccumFunc>;
    if (pfunc)
        pixelStatFuncs->push_back(pfunc);
}